

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall GdlRenderer::MaxJustificationLevel(GdlRenderer *this,int *pnJLevel)

{
  pointer ppGVar1;
  pointer ppGVar2;
  size_t ipglfc;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    ppGVar1 = (this->m_vpglfc).
              super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_vpglfc).
                      super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= uVar3) {
      uVar3 = 0;
      do {
        ppGVar2 = (this->m_vprultbl).
                  super__Vector_base<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->m_vprultbl).
                          super__Vector_base<GdlRuleTable_*,_std::allocator<GdlRuleTable_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3) <= uVar3)
        {
          return;
        }
        GdlRuleTable::MaxJustificationLevel(ppGVar2[uVar3],pnJLevel);
        uVar3 = uVar3 + 1;
      } while (*pnJLevel < 3);
      return;
    }
    GdlGlyphClassDefn::MaxJustificationLevel(ppGVar1[uVar3],pnJLevel);
    uVar3 = uVar3 + 1;
  } while (*pnJLevel < 3);
  return;
}

Assistant:

void GdlRenderer::MaxJustificationLevel(int * pnJLevel)
{
	//	Glyph atrributes:
	for (size_t ipglfc = 0; ipglfc < m_vpglfc.size(); ipglfc++)
	{
		m_vpglfc[ipglfc]->MaxJustificationLevel(pnJLevel);
		if (*pnJLevel >= kMaxJustLevel)
			return;
	}
	//	Rules:
	for (size_t iprultbl = 0; iprultbl < m_vprultbl.size(); iprultbl++)
	{
		m_vprultbl[iprultbl]->MaxJustificationLevel(pnJLevel);
		if (*pnJLevel >= kMaxJustLevel)
			return;
	}
}